

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_load_lines.c
# Opt level: O2

int main(void)

{
  return 0;
}

Assistant:

int main( void )
{
#ifndef REGTEST
    FILE * fh = fopen( "test_lines.txt", "w+" );
    char * rc;

    TESTCASE( fh != NULL );
    TESTCASE( fputs( "Foo\n\nBar\n", fh ) != EOF );

    rewind( fh );
    rc = _PDCLIB_load_lines( fh, 3 );
    fclose( fh );
    remove( "test_lines.txt" );

    TESTCASE( rc != NULL );
    TESTCASE( strcmp( rc, "Foo" ) == 0 );
    TESTCASE( strcmp( rc + 4, "" ) == 0 );
    TESTCASE( strcmp( rc + 5, "Bar" ) == 0 );

#endif
    return TEST_RESULTS;
}